

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void ppc6xx_tlb_invalidate_virt2
               (CPUPPCState_conflict2 *env,target_ulong eaddr,int is_code,int match_epn)

{
  int iVar1;
  CPUState *cpu;
  ppc6xx_tlb_t_conflict2 *pte0;
  int local_34;
  int nr;
  int way;
  ppc6xx_tlb_t_conflict2 *tlb;
  CPUState *cs;
  int match_epn_local;
  int is_code_local;
  target_ulong eaddr_local;
  CPUPPCState_conflict2 *env_local;
  
  cpu = env_cpu(env);
  for (local_34 = 0; local_34 < env->nb_ways; local_34 = local_34 + 1) {
    iVar1 = ppc6xx_tlb_getnum(env,eaddr,local_34,is_code);
    pte0 = (env->tlb).tlb6 + iVar1;
    iVar1 = pte_is_valid(pte0->pte0);
    if ((iVar1 != 0) && ((match_epn == 0 || (eaddr == pte0->EPN)))) {
      pte_invalidate(&pte0->pte0);
      tlb_flush_page_ppc64(cpu,pte0->EPN);
    }
  }
  return;
}

Assistant:

static inline void ppc6xx_tlb_invalidate_virt2(CPUPPCState *env,
                                               target_ulong eaddr,
                                               int is_code, int match_epn)
{
#if !defined(FLUSH_ALL_TLBS)
    CPUState *cs = env_cpu(env);
    ppc6xx_tlb_t *tlb;
    int way, nr;

    /* Invalidate ITLB + DTLB, all ways */
    for (way = 0; way < env->nb_ways; way++) {
        nr = ppc6xx_tlb_getnum(env, eaddr, way, is_code);
        tlb = &env->tlb.tlb6[nr];
        if (pte_is_valid(tlb->pte0) && (match_epn == 0 || eaddr == tlb->EPN)) {
            LOG_SWTLB("TLB invalidate %d/%d " TARGET_FMT_lx "\n", nr,
                      env->nb_tlb, eaddr);
            pte_invalidate(&tlb->pte0);
            tlb_flush_page(cs, tlb->EPN);
        }
    }
#else
    /* XXX: PowerPC specification say this is valid as well */
    ppc6xx_tlb_invalidate_all(env);
#endif
}